

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O1

void moveToHook(qfixed x,qfixed y,void *data)

{
  ByteStream *this;
  qfixed qVar1;
  long in_FS_OFFSET;
  char buf [256];
  qfixed local_138;
  qfixed local_130;
  char local_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_138 = y;
  local_130 = x;
  if (*(char *)((long)data + 8) == '\0') {
    QPdf::ByteStream::operator<<(*data,"h\n");
  }
  if (*(char *)((long)data + 0x60) == '\0') {
    QTransform::map((QTransform *)((long)data + 0x10),local_130,local_138,&local_130,&local_138);
  }
  qVar1 = local_130;
  this = *data;
  memset(local_128,0xaa,0x100);
  qt_real_to_string(qVar1,local_128);
  QPdf::ByteStream::operator<<(this,local_128);
  qVar1 = local_138;
  memset(local_128,0xaa,0x100);
  qt_real_to_string(qVar1,local_128);
  QPdf::ByteStream::operator<<(this,local_128);
  QPdf::ByteStream::operator<<(this,"m\n");
  *(undefined1 *)((long)data + 8) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void moveToHook(qfixed x, qfixed y, void *data)
{
    QPdf::Stroker *t = (QPdf::Stroker *)data;
    if (!t->first)
        *t->stream << "h\n";
    if (!t->cosmeticPen)
        t->matrix.map(x, y, &x, &y);
    *t->stream << x << y << "m\n";
    t->first = false;
}